

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall cmInstallExportGenerator::~cmInstallExportGenerator(cmInstallExportGenerator *this)

{
  cmInstallExportGenerator *this_local;
  
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallExportGenerator_00a8c5b8;
  if (this->EFGen != (cmExportInstallFileGenerator *)0x0) {
    (*(this->EFGen->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[1])();
  }
  std::__cxx11::string::~string((string *)&this->MainImportFile);
  std::__cxx11::string::~string((string *)&this->TempDir);
  std::__cxx11::string::~string((string *)&this->Namespace);
  std::__cxx11::string::~string((string *)&this->FileName);
  std::__cxx11::string::~string((string *)&this->FilePermissions);
  cmInstallGenerator::~cmInstallGenerator(&this->super_cmInstallGenerator);
  return;
}

Assistant:

cmInstallExportGenerator::~cmInstallExportGenerator()
{
  delete this->EFGen;
}